

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean read_restart_marker(j_decompress_ptr cinfo)

{
  boolean bVar1;
  j_decompress_ptr cinfo_local;
  
  if ((cinfo->unread_marker == 0) && (bVar1 = next_marker(cinfo), bVar1 == 0)) {
    cinfo_local._4_4_ = 0;
  }
  else {
    if (cinfo->unread_marker == cinfo->marker->next_restart_num + 0xd0) {
      cinfo->err->msg_code = 100;
      (cinfo->err->msg_parm).i[0] = cinfo->marker->next_restart_num;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,3);
      cinfo->unread_marker = 0;
    }
    else {
      bVar1 = (*cinfo->src->resync_to_restart)(cinfo,cinfo->marker->next_restart_num);
      if (bVar1 == 0) {
        return 0;
      }
    }
    cinfo->marker->next_restart_num = cinfo->marker->next_restart_num + 1U & 7;
    cinfo_local._4_4_ = 1;
  }
  return cinfo_local._4_4_;
}

Assistant:

METHODDEF(boolean)
read_restart_marker (j_decompress_ptr cinfo)
{
  /* Obtain a marker unless we already did. */
  /* Note that next_marker will complain if it skips any data. */
  if (cinfo->unread_marker == 0) {
    if (! next_marker(cinfo))
      return FALSE;
  }

  if (cinfo->unread_marker ==
      ((int) M_RST0 + cinfo->marker->next_restart_num)) {
    /* Normal case --- swallow the marker and let entropy decoder continue */
    TRACEMS1(cinfo, 3, JTRC_RST, cinfo->marker->next_restart_num);
    cinfo->unread_marker = 0;
  } else {
    /* Uh-oh, the restart markers have been messed up. */
    /* Let the data source manager determine how to resync. */
    if (! (*cinfo->src->resync_to_restart) (cinfo,
					    cinfo->marker->next_restart_num))
      return FALSE;
  }

  /* Update next-restart state */
  cinfo->marker->next_restart_num = (cinfo->marker->next_restart_num + 1) & 7;

  return TRUE;
}